

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

void isobusfs_log(log_level_t level,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  log_level_t in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  int milliseconds;
  char time_buffer [64];
  tm *time_info;
  timeval tv;
  char *level_str;
  char log_entry [192];
  char complete_log_entry [256];
  char *log_entry_00;
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined4 local_258;
  undefined4 local_254;
  undefined1 *local_250;
  undefined1 *local_248;
  uint local_23c;
  char local_238 [64];
  tm *local_1f8;
  timeval local_1f0;
  char *local_1e0;
  char local_1d8 [192];
  char local_118 [264];
  char *local_10;
  log_level_t local_4;
  
  if (in_AL != '\0') {
    local_2d8 = in_XMM0_Qa;
    local_2c8 = in_XMM1_Qa;
    local_2b8 = in_XMM2_Qa;
    local_2a8 = in_XMM3_Qa;
    local_298 = in_XMM4_Qa;
    local_288 = in_XMM5_Qa;
    local_278 = in_XMM6_Qa;
    local_268 = in_XMM7_Qa;
  }
  if (in_EDI <= log_level) {
    switch(in_EDI) {
    case LOG_LEVEL_INT:
    case LOG_LEVEL_INFO:
      local_1e0 = "INFO";
      break;
    case LOG_LEVEL_ERROR:
      local_1e0 = "ERROR";
      break;
    case LOG_LEVEL_WARN:
      local_1e0 = "WARNING";
      break;
    case LOG_LEVEL_DEBUG:
      local_1e0 = "DEBUG";
      break;
    default:
      local_1e0 = "UNKNOWN";
    }
    local_2f8 = in_RDX;
    local_2f0 = in_RCX;
    local_2e8 = in_R8;
    local_2e0 = in_R9;
    local_10 = in_RSI;
    local_4 = in_EDI;
    gettimeofday(&local_1f0,(__timezone_ptr_t)0x0);
    local_1f8 = localtime(&local_1f0.tv_sec);
    local_23c = (uint)(local_1f0.tv_usec / 1000);
    strftime(local_238,0x40,"%Y-%m-%d %H:%M:%S",local_1f8);
    log_entry_00 = local_238;
    sVar1 = strlen(local_238);
    __s = log_entry_00 + sVar1;
    sVar1 = strlen(local_238);
    snprintf(__s,0x40 - sVar1,".%03d",(ulong)local_23c);
    local_248 = local_308;
    local_250 = &stack0x00000008;
    local_254 = 0x30;
    local_258 = 0x10;
    vsnprintf(local_1d8,0xc0,local_10,&local_258);
    snprintf(local_118,0x100,"[%.40s] [%.10s]: %.150s",local_238,local_1e0,local_1d8);
    if ((interactive_mode & 1U) == 0) {
      fprintf(_stdout,"%s\n",local_118);
    }
    else {
      add_log_to_buffer(log_entry_00);
      if (local_4 == LOG_LEVEL_INT) {
        fprintf(_stdout,"%s",local_1d8);
        fflush(_stdout);
      }
    }
  }
  return;
}

Assistant:

void isobusfs_log(log_level_t level, const char *fmt, ...)
{
	char complete_log_entry[LOG_ENTRY_MAX_SIZE];
	char log_entry[LOG_ENTRY_MAX_SIZE - 64];
	const char *level_str;
	struct timeval tv;
	struct tm *time_info;
	char time_buffer[64];
	int milliseconds;
	va_list args;

	if (level > log_level)
		return;

	switch (level) {
	case LOG_LEVEL_DEBUG:
		level_str = "DEBUG";
		break;
	case LOG_LEVEL_INT:
	case LOG_LEVEL_INFO:
		level_str = "INFO";
		break;
	case LOG_LEVEL_WARN:
		level_str = "WARNING";
		break;
	case LOG_LEVEL_ERROR:
		level_str = "ERROR";
		break;
	default:
		level_str = "UNKNOWN";
		break;
	}

	gettimeofday(&tv, NULL);
	time_info = localtime(&tv.tv_sec);
	milliseconds = tv.tv_usec / 1000;
	strftime(time_buffer, sizeof(time_buffer), "%Y-%m-%d %H:%M:%S",
		 time_info);
	snprintf(time_buffer + strlen(time_buffer),
		 sizeof(time_buffer) - strlen(time_buffer),
		 ".%03d", milliseconds);

	va_start(args, fmt);
	vsnprintf(log_entry, sizeof(log_entry), fmt, args);
	va_end(args);

	snprintf(complete_log_entry, sizeof(complete_log_entry),
		 "[%.40s] [%.10s]: %.150s", time_buffer, level_str, log_entry);

	if (interactive_mode) {
		add_log_to_buffer(complete_log_entry);
		if (level == LOG_LEVEL_INT) {
			fprintf(stdout, "%s", log_entry);
			fflush(stdout);
		}
	} else {
		fprintf(stdout, "%s\n", complete_log_entry);
	}
}